

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_tester.cc
# Opt level: O1

void __thiscall
google::protobuf::MapReflectionTester::MapReflectionTester
          (MapReflectionTester *this,Descriptor *base_descriptor)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  DescriptorPool *this_00;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> _Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  AssertHelperData *pAVar4;
  int iVar5;
  EnumValueDescriptor *pEVar6;
  FieldDescriptor *pFVar7;
  AlphaNum *b;
  _Alloc_hider _Var8;
  char *pcVar9;
  char *in_R9;
  pointer *__ptr;
  bool bVar10;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view name_13;
  string_view name_14;
  string_view name_15;
  string_view name_16;
  string_view name_17;
  string_view name_18;
  string_view name_19;
  string_view name_20;
  string_view name_21;
  string_view name_22;
  string_view name_23;
  string_view name_24;
  string_view name_25;
  string_view name_26;
  string_view name_27;
  string_view name_28;
  string_view name_29;
  string_view name_30;
  string_view name_31;
  string_view name_32;
  string_view name_33;
  string_view name_34;
  string_view name_35;
  string_view name_36;
  initializer_list<const_google::protobuf::FieldDescriptor_*> __l;
  string_view v;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  all_map_descriptors;
  FieldDescriptor *fdesc;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  string local_1b0;
  AssertHelper local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_188;
  undefined1 local_180 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_178;
  undefined1 local_170 [32];
  undefined1 local_150 [8];
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  FieldDescriptor *local_130;
  FieldDescriptor *local_128;
  FieldDescriptor *local_120;
  FieldDescriptor *local_118;
  FieldDescriptor *local_110;
  FieldDescriptor *local_108;
  FieldDescriptor *local_100;
  FieldDescriptor *local_f8;
  FieldDescriptor *local_f0;
  FieldDescriptor *local_e8;
  FieldDescriptor *local_e0;
  FieldDescriptor *local_d8;
  FieldDescriptor *local_d0;
  FieldDescriptor *local_c8;
  FieldDescriptor *local_c0;
  FieldDescriptor *local_b8;
  FieldDescriptor *local_b0;
  FieldDescriptor *local_a8;
  FieldDescriptor *local_a0;
  FieldDescriptor *local_98;
  FieldDescriptor *local_90;
  FieldDescriptor *local_88;
  FieldDescriptor *local_80;
  FieldDescriptor *local_78;
  FieldDescriptor *local_70;
  FieldDescriptor *local_68;
  FieldDescriptor *local_60;
  FieldDescriptor *local_58;
  FieldDescriptor *local_50;
  FieldDescriptor *local_48;
  AssertHelper local_40;
  unsigned_long local_38;
  
  this->base_descriptor_ = base_descriptor;
  b = (AlphaNum *)base_descriptor->file_->package_;
  this_00 = base_descriptor->file_->pool_;
  _Var2._M_head_impl = (LogMessageData *)(b->piece_)._M_len;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(b->piece_)._M_str;
  local_180 = (undefined1  [8])&DAT_0000000d;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128c660;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name._M_str = local_1b0._M_dataplus._M_p;
  name._M_len = local_1b0._M_string_length;
  pEVar6 = DescriptorPool::FindEnumValueByName(this_00,name);
  this->map_enum_foo_ = pEVar6;
  paVar1 = &local_1b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])&DAT_0000000d;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128c66e;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_00._M_str = local_1b0._M_dataplus._M_p;
  name_00._M_len = local_1b0._M_string_length;
  pEVar6 = DescriptorPool::FindEnumValueByName(this_00,name_00);
  this->map_enum_bar_ = pEVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])&DAT_0000000d;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128c67c;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_01._M_str = local_1b0._M_dataplus._M_p;
  name_01._M_len = local_1b0._M_string_length;
  pEVar6 = DescriptorPool::FindEnumValueByName(this_00,name_01);
  this->map_enum_baz_ = pEVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])&DAT_00000011;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x112e6cd;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_02._M_str = local_1b0._M_dataplus._M_p;
  name_02._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_02);
  this->foreign_c_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])&DAT_0000001f;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128c68a;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_03._M_str = local_1b0._M_dataplus._M_p;
  name_03._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_03);
  this->map_int32_int32_key_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])&DAT_00000021;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128c6aa;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_04._M_str = local_1b0._M_dataplus._M_p;
  name_04._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_04);
  this->map_int32_int32_val_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])&DAT_0000001f;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128c6cc;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_05._M_str = local_1b0._M_dataplus._M_p;
  name_05._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_05);
  this->map_int64_int64_key_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])&DAT_00000021;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128c6ec;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_06._M_str = local_1b0._M_dataplus._M_p;
  name_06._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_06);
  this->map_int64_int64_val_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])&DAT_00000021;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128c70e;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_07._M_str = local_1b0._M_dataplus._M_p;
  name_07._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_07);
  this->map_uint32_uint32_key_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])0x23;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128c730;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_08._M_str = local_1b0._M_dataplus._M_p;
  name_08._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_08);
  this->map_uint32_uint32_val_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])&DAT_00000021;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128c754;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_09._M_str = local_1b0._M_dataplus._M_p;
  name_09._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_09);
  this->map_uint64_uint64_key_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])0x23;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128c776;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_10._M_str = local_1b0._M_dataplus._M_p;
  name_10._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_10);
  this->map_uint64_uint64_val_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])&DAT_00000021;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128c79a;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_11._M_str = local_1b0._M_dataplus._M_p;
  name_11._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_11);
  this->map_sint32_sint32_key_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])0x23;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128c7bc;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_12._M_str = local_1b0._M_dataplus._M_p;
  name_12._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_12);
  this->map_sint32_sint32_val_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])&DAT_00000021;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128c7e0;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_13._M_str = local_1b0._M_dataplus._M_p;
  name_13._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_13);
  this->map_sint64_sint64_key_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])0x23;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128c802;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_14._M_str = local_1b0._M_dataplus._M_p;
  name_14._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_14);
  this->map_sint64_sint64_val_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])0x23;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128c826;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_15._M_str = local_1b0._M_dataplus._M_p;
  name_15._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_15);
  this->map_fixed32_fixed32_key_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])0x25;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128c84a;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_16._M_str = local_1b0._M_dataplus._M_p;
  name_16._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_16);
  this->map_fixed32_fixed32_val_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])0x23;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128c870;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_17._M_str = local_1b0._M_dataplus._M_p;
  name_17._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_17);
  this->map_fixed64_fixed64_key_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])0x25;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128c894;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_18._M_str = local_1b0._M_dataplus._M_p;
  name_18._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_18);
  this->map_fixed64_fixed64_val_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])0x25;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128c8ba;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_19._M_str = local_1b0._M_dataplus._M_p;
  name_19._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_19);
  this->map_sfixed32_sfixed32_key_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])0x27;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128c8e0;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_20._M_str = local_1b0._M_dataplus._M_p;
  name_20._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_20);
  this->map_sfixed32_sfixed32_val_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])0x25;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128c908;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_21._M_str = local_1b0._M_dataplus._M_p;
  name_21._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_21);
  this->map_sfixed64_sfixed64_key_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])0x27;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128c92e;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_22._M_str = local_1b0._M_dataplus._M_p;
  name_22._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_22);
  this->map_sfixed64_sfixed64_val_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])&DAT_0000001f;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128c956;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_23._M_str = local_1b0._M_dataplus._M_p;
  name_23._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_23);
  this->map_int32_float_key_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])&DAT_00000021;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128c976;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_24._M_str = local_1b0._M_dataplus._M_p;
  name_24._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_24);
  this->map_int32_float_val_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])&DAT_00000020;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128c998;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_25._M_str = local_1b0._M_dataplus._M_p;
  name_25._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_25);
  this->map_int32_double_key_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])0x22;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128c9b9;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_26._M_str = local_1b0._M_dataplus._M_p;
  name_26._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_26);
  this->map_int32_double_val_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])&DAT_0000001d;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128c9dc;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_27._M_str = local_1b0._M_dataplus._M_p;
  name_27._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_27);
  this->map_bool_bool_key_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])&DAT_0000001f;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128c9fa;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_28._M_str = local_1b0._M_dataplus._M_p;
  name_28._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_28);
  this->map_bool_bool_val_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])&DAT_00000021;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128ca1a;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_29._M_str = local_1b0._M_dataplus._M_p;
  name_29._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_29);
  this->map_string_string_key_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])0x23;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128ca3c;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_30._M_str = local_1b0._M_dataplus._M_p;
  name_30._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_30);
  this->map_string_string_val_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])&DAT_0000001f;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128ca60;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_31._M_str = local_1b0._M_dataplus._M_p;
  name_31._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_31);
  this->map_int32_bytes_key_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])&DAT_00000021;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128ca80;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_32._M_str = local_1b0._M_dataplus._M_p;
  name_32._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_32);
  this->map_int32_bytes_val_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])&DAT_0000001e;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128caa2;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_33._M_str = local_1b0._M_dataplus._M_p;
  name_33._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_33);
  this->map_int32_enum_key_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])&DAT_00000020;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128cac1;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_34._M_str = local_1b0._M_dataplus._M_p;
  name_34._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_34);
  this->map_int32_enum_val_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])&DAT_00000028;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128cae2;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_35._M_str = local_1b0._M_dataplus._M_p;
  name_35._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_35);
  this->map_int32_foreign_message_key_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_180 = (undefined1  [8])&DAT_0000002a;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x128cb0b;
  local_150 = (undefined1  [8])paVar3;
  local_148._M_head_impl = _Var2._M_head_impl;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b0,(lts_20250127 *)local_150,(AlphaNum *)local_180,b);
  name_36._M_str = local_1b0._M_dataplus._M_p;
  name_36._M_len = local_1b0._M_string_length;
  pFVar7 = DescriptorPool::FindFieldByName(this_00,name_36);
  this->map_int32_foreign_message_val_ = pFVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  bVar10 = this->map_enum_foo_ != (EnumValueDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_enum_foo_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x6a,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_enum_bar_ != (EnumValueDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_enum_bar_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x6b,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_enum_baz_ != (EnumValueDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_enum_baz_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x6c,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_int32_int32_key_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_int32_int32_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x6d,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_int32_int32_val_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_int32_int32_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x6e,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_int64_int64_key_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_int64_int64_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x6f,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_int64_int64_val_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_int64_int64_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x70,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_uint32_uint32_key_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_uint32_uint32_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x71,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_uint32_uint32_val_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_uint32_uint32_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x72,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_uint64_uint64_key_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_uint64_uint64_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x73,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_uint64_uint64_val_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_uint64_uint64_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x74,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_sint32_sint32_key_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_sint32_sint32_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x75,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_sint32_sint32_val_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_sint32_sint32_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x76,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_sint64_sint64_key_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_sint64_sint64_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x77,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_sint64_sint64_val_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_sint64_sint64_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x78,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_fixed32_fixed32_key_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_fixed32_fixed32_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x79,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_fixed32_fixed32_val_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_fixed32_fixed32_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x7a,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_fixed64_fixed64_key_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_fixed64_fixed64_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x7b,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_fixed64_fixed64_val_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_fixed64_fixed64_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x7c,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_sfixed32_sfixed32_key_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_sfixed32_sfixed32_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x7d,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_sfixed32_sfixed32_val_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_sfixed32_sfixed32_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x7e,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_sfixed64_sfixed64_key_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_sfixed64_sfixed64_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x7f,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_sfixed64_sfixed64_val_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_sfixed64_sfixed64_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x80,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_int32_float_key_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_int32_float_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x81,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_int32_float_val_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_int32_float_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x82,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_int32_double_key_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_int32_double_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x83,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_int32_double_val_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_int32_double_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x84,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_bool_bool_key_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_bool_bool_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x85,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_bool_bool_val_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_bool_bool_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x86,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_string_string_key_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_string_string_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x87,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_string_string_val_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_string_string_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x88,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_int32_bytes_key_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_int32_bytes_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x89,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_int32_bytes_val_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_int32_bytes_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x8a,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_int32_enum_key_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_int32_enum_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x8b,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_int32_enum_val_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_int32_enum_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x8c,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_int32_foreign_message_key_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_int32_foreign_message_key_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x8d,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  bVar10 = this->map_int32_foreign_message_val_ != (FieldDescriptor *)0x0;
  local_180[0] = bVar10;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_150,(internal *)local_180,
               (AssertionResult *)"map_int32_foreign_message_val_ == nullptr","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x8e,(char *)local_150);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_150 != (undefined1  [8])&local_140) {
      operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
    }
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  local_150 = (undefined1  [8])this->map_int32_int32_key_;
  local_148._M_head_impl = (LogMessageData *)this->map_int32_int32_val_;
  local_140._M_allocated_capacity = (size_type)this->map_int64_int64_key_;
  local_140._8_8_ = this->map_int64_int64_val_;
  local_130 = this->map_uint32_uint32_key_;
  local_128 = this->map_uint32_uint32_val_;
  local_120 = this->map_uint64_uint64_key_;
  local_118 = this->map_uint64_uint64_val_;
  local_110 = this->map_sint32_sint32_key_;
  local_108 = this->map_sint32_sint32_val_;
  local_100 = this->map_sint64_sint64_key_;
  local_f8 = this->map_sint64_sint64_val_;
  local_f0 = this->map_fixed32_fixed32_key_;
  local_e8 = this->map_fixed32_fixed32_val_;
  local_e0 = this->map_fixed64_fixed64_key_;
  local_d8 = this->map_fixed64_fixed64_val_;
  local_d0 = this->map_sfixed32_sfixed32_key_;
  local_c8 = this->map_sfixed32_sfixed32_val_;
  local_c0 = this->map_sfixed64_sfixed64_key_;
  local_b8 = this->map_sfixed64_sfixed64_val_;
  local_b0 = this->map_int32_float_key_;
  local_a8 = this->map_int32_float_val_;
  local_a0 = this->map_int32_double_key_;
  local_98 = this->map_int32_double_val_;
  local_90 = this->map_bool_bool_key_;
  local_88 = this->map_bool_bool_val_;
  local_80 = this->map_string_string_key_;
  local_78 = this->map_string_string_val_;
  local_70 = this->map_int32_bytes_key_;
  local_68 = this->map_int32_bytes_val_;
  local_60 = this->map_int32_enum_key_;
  local_58 = this->map_int32_enum_val_;
  local_50 = this->map_int32_foreign_message_key_;
  local_48 = this->map_int32_foreign_message_val_;
  __l._M_len = 0x22;
  __l._M_array = (iterator)local_150;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)&local_1b0,__l,(allocator_type *)local_180);
  if (local_1b0._M_dataplus._M_p != (pointer)local_1b0._M_string_length) {
    _Var8._M_p = local_1b0._M_dataplus._M_p;
    do {
      pAVar4 = *(AssertHelperData **)_Var8._M_p;
      local_190.data_ = pAVar4;
      if ((pAVar4->message)._M_string_length == 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_150,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                   ,0xb4,"fdesc->containing_type() != nullptr");
        v._M_len = (ulong)*(ushort *)(local_190.data_)->file;
        v._M_str = (char *)(~v._M_len + (long)(local_190.data_)->file);
        absl::lts_20250127::log_internal::LogMessage::operator<<((LogMessage *)local_150,v);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_150);
      }
      if ((*(short *)pAVar4->file == 3) &&
         (iVar5 = bcmp((short *)((long)pAVar4->file + -4),"key",3), iVar5 == 0)) {
        local_180 = (undefined1  [8])
                    Descriptor::map_key((Descriptor *)(pAVar4->message)._M_string_length);
        testing::internal::
        CmpHelperEQ<google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*>
                  ((internal *)local_150,"fdesc->containing_type()->map_key()","fdesc",
                   (FieldDescriptor **)local_180,(FieldDescriptor **)&local_190);
        if (local_150[0] == (lts_20250127)0x0) {
          testing::Message::Message((Message *)local_180);
          pcVar9 = anon_var_dwarf_a12c75 + 5;
          if (local_148._M_head_impl != (LogMessageData *)0x0) {
            pcVar9 = (char *)((local_148._M_head_impl)->entry).full_filename_._M_len;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_40,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                     ,0xb6,pcVar9);
          testing::internal::AssertHelper::operator=(&local_40,(Message *)local_180);
LAB_00c1d0a6:
          testing::internal::AssertHelper::~AssertHelper(&local_40);
          if (local_180 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_180 + 8))();
          }
        }
      }
      else {
        local_180 = (undefined1  [8])(ulong)*(ushort *)pAVar4->file;
        local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)pAVar4->file + ~(ulong)local_180);
        testing::internal::CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,char[6]>
                  ((internal *)local_150,"fdesc->name()","\"value\"",
                   (basic_string_view<char,_std::char_traits<char>_> *)local_180,
                   (char (*) [6])0x1190ec8);
        if (local_150[0] == (lts_20250127)0x0) {
          testing::Message::Message((Message *)local_180);
          pcVar9 = anon_var_dwarf_a12c75 + 5;
          if (local_148._M_head_impl != (LogMessageData *)0x0) {
            pcVar9 = (char *)((local_148._M_head_impl)->entry).full_filename_._M_len;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_40,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                     ,0xb8,pcVar9);
          testing::internal::AssertHelper::operator=(&local_40,(Message *)local_180);
          testing::internal::AssertHelper::~AssertHelper(&local_40);
          if (local_180 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_180 + 8))();
          }
        }
        if (local_148._M_head_impl != (LogMessageData *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_148,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_148._M_head_impl);
        }
        local_180 = (undefined1  [8])
                    Descriptor::map_value
                              ((Descriptor *)((local_190.data_)->message)._M_string_length);
        testing::internal::
        CmpHelperEQ<google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*>
                  ((internal *)local_150,"fdesc->containing_type()->map_value()","fdesc",
                   (FieldDescriptor **)local_180,(FieldDescriptor **)&local_190);
        if (local_150[0] == (lts_20250127)0x0) {
          testing::Message::Message((Message *)local_180);
          pcVar9 = anon_var_dwarf_a12c75 + 5;
          if ((_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
               )local_148._M_head_impl !=
              (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
               )0x0) {
            pcVar9 = (char *)((local_148._M_head_impl)->entry).full_filename_._M_len;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_40,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                     ,0xb9,pcVar9);
          testing::internal::AssertHelper::operator=(&local_40,(Message *)local_180);
          goto LAB_00c1d0a6;
        }
      }
      if (local_148._M_head_impl != (LogMessageData *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_148,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_148._M_head_impl);
      }
      _Var8._M_p = _Var8._M_p + 8;
    } while (_Var8._M_p != (pointer)local_1b0._M_string_length);
  }
  local_180 = (undefined1  [8])&DAT_00000030;
  local_150 = (undefined1  [8])&local_140;
  local_150 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_150,(ulong)local_180);
  local_140._M_allocated_capacity = (size_type)local_180;
  *(undefined8 *)((long)local_150 + 0x20) = 0x206e692073656f67;
  *(undefined8 *)((long)local_150 + 0x28) = 0x7061656820656874;
  *(undefined8 *)((long)local_150 + 0x10) = 0x6972747320676e6f;
  *(undefined8 *)((long)local_150 + 0x18) = 0x207461687420676e;
  *(undefined8 *)local_150 = 0x2073692073696854;
  *(undefined8 *)((long)local_150 + 8) = 0x6c20797265762061;
  local_148._M_head_impl = (LogMessageData *)local_180;
  *(char *)((long)local_150 + (long)local_180) = '\0';
  local_40.data_ = (AssertHelperData *)&DAT_0000000f;
  if (local_150 != (undefined1  [8])&local_140) {
    local_40.data_ = (AssertHelperData *)local_180;
  }
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_170[0] = '\0';
  local_38 = 0xf;
  local_180 = (undefined1  [8])local_170;
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)&local_190,"long_string().capacity()","std::string().capacity()",
             (unsigned_long *)&local_40,&local_38);
  if (local_180 != (undefined1  [8])local_170) {
    operator_delete((void *)local_180,CONCAT71(local_170._1_7_,local_170[0]) + 1);
  }
  if (local_150 != (undefined1  [8])&local_140) {
    operator_delete((void *)local_150,(ulong)(local_140._M_allocated_capacity + 1));
  }
  if (local_190.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_150);
    if (local_188 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar9 = (local_188->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0xbe,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_180,(Message *)local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_180);
    if (local_150 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_150 + 8))();
    }
  }
  if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_188,local_188);
  }
  local_180 = (undefined1  [8])&DAT_00000036;
  local_150 = (undefined1  [8])&local_140;
  local_150 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_150,(ulong)local_180);
  local_140._M_allocated_capacity = (size_type)local_180;
  *(undefined8 *)((long)local_150 + 0x20) = 0x6f67207461687420;
  *(undefined8 *)((long)local_150 + 0x28) = 0x6874206e69207365;
  *(undefined8 *)((long)local_150 + 0x10) = 0x6e6f6c2079726576;
  *(undefined8 *)((long)local_150 + 0x18) = 0x676e697274732067;
  *(undefined8 *)local_150 = 0x2073692073696854;
  *(undefined8 *)((long)local_150 + 8) = 0x20726568746f6e61;
  builtin_strncpy((char *)((long)local_150 + 0x2e),"the heap",8);
  local_148._M_head_impl = (LogMessageData *)local_180;
  *(char *)((long)local_150 + (long)local_180) = '\0';
  local_40.data_ = (AssertHelperData *)&DAT_0000000f;
  if (local_150 != (undefined1  [8])&local_140) {
    local_40.data_ = (AssertHelperData *)local_180;
  }
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_170[0] = '\0';
  local_38 = 0xf;
  local_180 = (undefined1  [8])local_170;
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)&local_190,"long_string_2().capacity()","std::string().capacity()",
             (unsigned_long *)&local_40,&local_38);
  if (local_180 != (undefined1  [8])local_170) {
    operator_delete((void *)local_180,CONCAT71(local_170._1_7_,local_170[0]) + 1);
  }
  if (local_150 != (undefined1  [8])&local_140) {
    operator_delete((void *)local_150,(ulong)(local_140._M_allocated_capacity + 1));
  }
  if (local_190.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_150);
    if (local_188 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar9 = (local_188->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0xbf,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_180,(Message *)local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_180);
    if (local_150 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_150 + 8))();
    }
  }
  if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_188,local_188);
  }
  if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
    operator_delete(local_1b0._M_dataplus._M_p,
                    local_1b0.field_2._M_allocated_capacity - (long)local_1b0._M_dataplus._M_p);
  }
  return;
}

Assistant:

MapReflectionTester::MapReflectionTester(const Descriptor* base_descriptor)
    : base_descriptor_(base_descriptor) {
  const DescriptorPool* pool = base_descriptor->file()->pool();
  const absl::string_view package = base_descriptor->file()->package();

  map_enum_foo_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".MAP_ENUM_FOO"));
  map_enum_bar_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".MAP_ENUM_BAR"));
  map_enum_baz_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".MAP_ENUM_BAZ"));

  foreign_c_ =
      pool->FindFieldByName(absl::StrCat(package, ".ForeignMessage.c"));
  map_int32_int32_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32Int32Entry.key"));
  map_int32_int32_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32Int32Entry.value"));
  map_int64_int64_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt64Int64Entry.key"));
  map_int64_int64_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt64Int64Entry.value"));
  map_uint32_uint32_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapUint32Uint32Entry.key"));
  map_uint32_uint32_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapUint32Uint32Entry.value"));
  map_uint64_uint64_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapUint64Uint64Entry.key"));
  map_uint64_uint64_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapUint64Uint64Entry.value"));
  map_sint32_sint32_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapSint32Sint32Entry.key"));
  map_sint32_sint32_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapSint32Sint32Entry.value"));
  map_sint64_sint64_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapSint64Sint64Entry.key"));
  map_sint64_sint64_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapSint64Sint64Entry.value"));
  map_fixed32_fixed32_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapFixed32Fixed32Entry.key"));
  map_fixed32_fixed32_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapFixed32Fixed32Entry.value"));
  map_fixed64_fixed64_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapFixed64Fixed64Entry.key"));
  map_fixed64_fixed64_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapFixed64Fixed64Entry.value"));
  map_sfixed32_sfixed32_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapSfixed32Sfixed32Entry.key"));
  map_sfixed32_sfixed32_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapSfixed32Sfixed32Entry.value"));
  map_sfixed64_sfixed64_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapSfixed64Sfixed64Entry.key"));
  map_sfixed64_sfixed64_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapSfixed64Sfixed64Entry.value"));
  map_int32_float_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32FloatEntry.key"));
  map_int32_float_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32FloatEntry.value"));
  map_int32_double_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32DoubleEntry.key"));
  map_int32_double_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32DoubleEntry.value"));
  map_bool_bool_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapBoolBoolEntry.key"));
  map_bool_bool_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapBoolBoolEntry.value"));
  map_string_string_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapStringStringEntry.key"));
  map_string_string_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapStringStringEntry.value"));
  map_int32_bytes_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32BytesEntry.key"));
  map_int32_bytes_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32BytesEntry.value"));
  map_int32_enum_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32EnumEntry.key"));
  map_int32_enum_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32EnumEntry.value"));
  map_int32_foreign_message_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32ForeignMessageEntry.key"));
  map_int32_foreign_message_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32ForeignMessageEntry.value"));

  EXPECT_FALSE(map_enum_foo_ == nullptr);
  EXPECT_FALSE(map_enum_bar_ == nullptr);
  EXPECT_FALSE(map_enum_baz_ == nullptr);
  EXPECT_FALSE(map_int32_int32_key_ == nullptr);
  EXPECT_FALSE(map_int32_int32_val_ == nullptr);
  EXPECT_FALSE(map_int64_int64_key_ == nullptr);
  EXPECT_FALSE(map_int64_int64_val_ == nullptr);
  EXPECT_FALSE(map_uint32_uint32_key_ == nullptr);
  EXPECT_FALSE(map_uint32_uint32_val_ == nullptr);
  EXPECT_FALSE(map_uint64_uint64_key_ == nullptr);
  EXPECT_FALSE(map_uint64_uint64_val_ == nullptr);
  EXPECT_FALSE(map_sint32_sint32_key_ == nullptr);
  EXPECT_FALSE(map_sint32_sint32_val_ == nullptr);
  EXPECT_FALSE(map_sint64_sint64_key_ == nullptr);
  EXPECT_FALSE(map_sint64_sint64_val_ == nullptr);
  EXPECT_FALSE(map_fixed32_fixed32_key_ == nullptr);
  EXPECT_FALSE(map_fixed32_fixed32_val_ == nullptr);
  EXPECT_FALSE(map_fixed64_fixed64_key_ == nullptr);
  EXPECT_FALSE(map_fixed64_fixed64_val_ == nullptr);
  EXPECT_FALSE(map_sfixed32_sfixed32_key_ == nullptr);
  EXPECT_FALSE(map_sfixed32_sfixed32_val_ == nullptr);
  EXPECT_FALSE(map_sfixed64_sfixed64_key_ == nullptr);
  EXPECT_FALSE(map_sfixed64_sfixed64_val_ == nullptr);
  EXPECT_FALSE(map_int32_float_key_ == nullptr);
  EXPECT_FALSE(map_int32_float_val_ == nullptr);
  EXPECT_FALSE(map_int32_double_key_ == nullptr);
  EXPECT_FALSE(map_int32_double_val_ == nullptr);
  EXPECT_FALSE(map_bool_bool_key_ == nullptr);
  EXPECT_FALSE(map_bool_bool_val_ == nullptr);
  EXPECT_FALSE(map_string_string_key_ == nullptr);
  EXPECT_FALSE(map_string_string_val_ == nullptr);
  EXPECT_FALSE(map_int32_bytes_key_ == nullptr);
  EXPECT_FALSE(map_int32_bytes_val_ == nullptr);
  EXPECT_FALSE(map_int32_enum_key_ == nullptr);
  EXPECT_FALSE(map_int32_enum_val_ == nullptr);
  EXPECT_FALSE(map_int32_foreign_message_key_ == nullptr);
  EXPECT_FALSE(map_int32_foreign_message_val_ == nullptr);

  std::vector<const FieldDescriptor*> all_map_descriptors = {
      map_int32_int32_key_,
      map_int32_int32_val_,
      map_int64_int64_key_,
      map_int64_int64_val_,
      map_uint32_uint32_key_,
      map_uint32_uint32_val_,
      map_uint64_uint64_key_,
      map_uint64_uint64_val_,
      map_sint32_sint32_key_,
      map_sint32_sint32_val_,
      map_sint64_sint64_key_,
      map_sint64_sint64_val_,
      map_fixed32_fixed32_key_,
      map_fixed32_fixed32_val_,
      map_fixed64_fixed64_key_,
      map_fixed64_fixed64_val_,
      map_sfixed32_sfixed32_key_,
      map_sfixed32_sfixed32_val_,
      map_sfixed64_sfixed64_key_,
      map_sfixed64_sfixed64_val_,
      map_int32_float_key_,
      map_int32_float_val_,
      map_int32_double_key_,
      map_int32_double_val_,
      map_bool_bool_key_,
      map_bool_bool_val_,
      map_string_string_key_,
      map_string_string_val_,
      map_int32_bytes_key_,
      map_int32_bytes_val_,
      map_int32_enum_key_,
      map_int32_enum_val_,
      map_int32_foreign_message_key_,
      map_int32_foreign_message_val_};
  for (const FieldDescriptor* fdesc : all_map_descriptors) {
    ABSL_CHECK(fdesc->containing_type() != nullptr) << fdesc->name();
    if (fdesc->name() == "key") {
      EXPECT_EQ(fdesc->containing_type()->map_key(), fdesc);
    } else {
      EXPECT_EQ(fdesc->name(), "value");
      EXPECT_EQ(fdesc->containing_type()->map_value(), fdesc);
    }
  }

  // Must be heap allocated.
  EXPECT_NE(long_string().capacity(), std::string().capacity());
  EXPECT_NE(long_string_2().capacity(), std::string().capacity());
}